

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::initiatorFixtureHeartBeatInterval_TestRequestNeededHelper::RunImpl
          (initiatorFixtureHeartBeatInterval_TestRequestNeededHelper *this)

{
  Message *pMVar1;
  TestResults *pTVar2;
  Session *pSVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  Message receivedLogon;
  Message sentLogon;
  int local_434;
  undefined **local_430;
  char *local_428;
  char *pcStack_420;
  undefined1 local_418 [16];
  char *pcStack_408;
  Logon local_2c0;
  Message local_168 [344];
  
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_date = 0x257e44;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time = 0x1aa324d61000;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_date = 0x268636;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_time = 0x354649ac2000;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                startTimeStamp.super_DateTime.m_time + 4);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
                super_DateTime.m_time + 4);
  (*(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
    _vptr_Responder[8])(this,1,0,0x1f);
  FIX::DateTime::nowUtc();
  createLogon(&local_2c0,"TW","ISLD",1);
  FIX::Message::Message(local_168,(Message *)&local_2c0);
  FIX::Message::~Message((Message *)&local_2c0);
  FIX::Session::send((Message *)(this->super_initiatorFixture).super_sessionFixture.object);
  FIX::Session::next();
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  createLogon((Logon *)local_418,"ISLD","TW",1);
  FIX::Message::Message((Message *)&local_2c0,(Message *)local_418);
  FIX::Message::~Message((Message *)local_418);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::DateTime::nowUtc();
  local_428 = (char *)local_418._8_8_;
  pcStack_420 = pcStack_408;
  local_430 = &PTR__DateTime_00324850;
  FIX::Session::next(pMVar1,(UtcTimeStamp *)&local_2c0,SUB81(&local_430,0));
  FIX::process_sleep(2.0);
  FIX::Session::next();
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar4;
  local_430 = (undefined **)CONCAT44(local_430._4_4_,4);
  local_434 = FIX::SessionState::getNextSenderMsgSeqNum
                        ((SessionState *)
                         ((this->super_initiatorFixture).super_sessionFixture.object + 0x250));
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)local_418,*ppTVar5,0x78e);
  UnitTest::CheckEqual<int,int>(pTVar2,(int *)&local_430,&local_434,(TestDetails *)local_418);
  pSVar3 = (this->super_initiatorFixture).super_sessionFixture.object;
  if ((pSVar3[0x261] != (Session)0x1) || (((byte)pSVar3[0x263] & 1) == 0)) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar2 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)local_418,*ppTVar5,0x78f);
    UnitTest::TestResults::OnTestFailure(pTVar2,(TestDetails *)local_418,"object->isLoggedOn()");
  }
  FIX::Message::~Message((Message *)&local_2c0);
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, HeartBeatInterval_TestRequestNeeded) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  //Force Heartbeat Interval Flow
  process_sleep(2);

  object->next();
  CHECK_EQUAL(4, object->getExpectedSenderNum());
  CHECK(object->isLoggedOn());
}